

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O2

void __thiscall
duckdb::UngroupedAggregateLocalSinkState::~UngroupedAggregateLocalSinkState
          (UngroupedAggregateLocalSinkState *this)

{
  ~UngroupedAggregateLocalSinkState(this);
  operator_delete(this);
  return;
}

Assistant:

UngroupedAggregateLocalSinkState(const PhysicalUngroupedAggregate &op, const vector<LogicalType> &child_types,
	                                 UngroupedAggregateGlobalSinkState &gstate_p, ExecutionContext &context)
	    : state(gstate_p.state), execute_state(context.client, op.aggregates, child_types) {
		auto &gstate = gstate_p.Cast<UngroupedAggregateGlobalSinkState>();
		InitializeDistinctAggregates(op, gstate, context);
	}